

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jaeger_types.h
# Opt level: O0

void __thiscall jaegertracing::thrift::Span::Span(Span *this)

{
  Span *this_local;
  
  apache::thrift::TBase::TBase((TBase *)this);
  *(code **)this = snprintf;
  *(code **)this = snprintf;
  *(undefined8 *)(this + 8) = 0;
  *(undefined8 *)(this + 0x10) = 0;
  *(undefined8 *)(this + 0x18) = 0;
  *(undefined8 *)(this + 0x20) = 0;
  std::__cxx11::string::string((string *)(this + 0x28));
  std::vector<jaegertracing::thrift::SpanRef,_std::allocator<jaegertracing::thrift::SpanRef>_>::
  vector((vector<jaegertracing::thrift::SpanRef,_std::allocator<jaegertracing::thrift::SpanRef>_> *)
         (this + 0x48));
  *(undefined4 *)(this + 0x60) = 0;
  *(undefined8 *)(this + 0x68) = 0;
  *(undefined8 *)(this + 0x70) = 0;
  std::vector<jaegertracing::thrift::Tag,_std::allocator<jaegertracing::thrift::Tag>_>::vector
            ((vector<jaegertracing::thrift::Tag,_std::allocator<jaegertracing::thrift::Tag>_> *)
             (this + 0x78));
  std::vector<jaegertracing::thrift::Log,_std::allocator<jaegertracing::thrift::Log>_>::vector
            ((vector<jaegertracing::thrift::Log,_std::allocator<jaegertracing::thrift::Log>_> *)
             (this + 0x90));
  _Span__isset::_Span__isset((_Span__isset *)(this + 0xa8));
  return;
}

Assistant:

Span() : traceIdLow(0), traceIdHigh(0), spanId(0), parentSpanId(0), operationName(), flags(0), startTime(0), duration(0) {
  }